

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

MethodOptions * __thiscall
google::protobuf::MethodDescriptorProto::_internal_mutable_options(MethodDescriptorProto *this)

{
  MethodOptions *pMVar1;
  long in_RDI;
  MethodOptions *p;
  MethodDescriptorProto *in_stack_ffffffffffffffe0;
  
  *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) | 8;
  if (*(long *)(in_RDI + 0x30) == 0) {
    GetArenaNoVirtual(in_stack_ffffffffffffffe0);
    pMVar1 = MessageLite::CreateMaybeMessage<google::protobuf::MethodOptions>((Arena *)0x4e2f91);
    *(MethodOptions **)(in_RDI + 0x30) = pMVar1;
  }
  return *(MethodOptions **)(in_RDI + 0x30);
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::MethodOptions* MethodDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000008u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<PROTOBUF_NAMESPACE_ID::MethodOptions>(GetArenaNoVirtual());
    options_ = p;
  }
  return options_;
}